

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alter_binder.cpp
# Opt level: O2

BindResult * __thiscall
duckdb::AlterBinder::BindExpression
          (BindResult *__return_storage_ptr__,AlterBinder *this,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *expr_ptr,idx_t depth,bool root_expression)

{
  ExpressionClass EVar1;
  BaseExpression *this_00;
  ColumnRefExpression *col_ref;
  allocator local_59;
  BinderException local_58;
  string local_48;
  
  this_00 = &unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
             ::operator*(expr_ptr)->super_BaseExpression;
  EVar1 = this_00->expression_class;
  if (EVar1 == COLUMN_REF) {
    col_ref = BaseExpression::Cast<duckdb::ColumnRefExpression>(this_00);
    BindColumnReference(__return_storage_ptr__,this,col_ref,depth);
  }
  else {
    if (EVar1 == SUBQUERY) {
      ::std::__cxx11::string::string
                ((string *)&local_48,"cannot use subquery in alter statement",&local_59);
      BinderException::Unsupported(&local_58,(ParsedExpression *)this_00,&local_48);
      BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
    }
    else {
      if (EVar1 != WINDOW) {
        ExpressionBinder::BindExpression
                  (__return_storage_ptr__,&this->super_ExpressionBinder,expr_ptr,depth,false);
        return __return_storage_ptr__;
      }
      ::std::__cxx11::string::string
                ((string *)&local_48,"window functions are not allowed in alter statement",&local_59
                );
      BinderException::Unsupported(&local_58,(ParsedExpression *)this_00,&local_48);
      BindResult::BindResult(__return_storage_ptr__,&local_58.super_Exception);
    }
    ::std::runtime_error::~runtime_error((runtime_error *)&local_58);
    ::std::__cxx11::string::~string((string *)&local_48);
  }
  return __return_storage_ptr__;
}

Assistant:

BindResult AlterBinder::BindExpression(unique_ptr<ParsedExpression> &expr_ptr, idx_t depth, bool root_expression) {
	auto &expr = *expr_ptr;
	switch (expr.GetExpressionClass()) {
	case ExpressionClass::WINDOW:
		return BindResult(BinderException::Unsupported(expr, "window functions are not allowed in alter statement"));
	case ExpressionClass::SUBQUERY:
		return BindResult(BinderException::Unsupported(expr, "cannot use subquery in alter statement"));
	case ExpressionClass::COLUMN_REF:
		return BindColumnReference(expr.Cast<ColumnRefExpression>(), depth);
	default:
		return ExpressionBinder::BindExpression(expr_ptr, depth);
	}
}